

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerJob.h
# Opt level: O2

void __thiscall
xmrig::WorkerJob<6UL>::nextRound(WorkerJob<6UL> *this,uint32_t rounds,uint32_t roundSize)

{
  size_t sVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  long lVar6;
  size_t i;
  bool bVar7;
  
  uVar4 = (ulong)this->m_index;
  uVar2 = this->m_rounds[uVar4] + 1;
  this->m_rounds[uVar4] = uVar2;
  if (uVar2 % rounds == 0) {
    for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
      uVar3 = Nonce::next((uint8_t)uVar4,
                          *(uint32_t *)
                           (this->m_blobs[uVar4] + this->m_jobs[uVar4].m_size * lVar6 + 0x27),
                          roundSize * rounds);
      uVar4 = (ulong)this->m_index;
      *(uint32_t *)(this->m_blobs[uVar4] + this->m_jobs[uVar4].m_size * lVar6 + 0x27) = uVar3;
    }
  }
  else {
    sVar1 = this->m_jobs[uVar4].m_size;
    puVar5 = this->m_blobs[uVar4] + 0x27;
    lVar6 = 6;
    while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
      *(uint32_t *)puVar5 = *(int *)puVar5 + roundSize;
      puVar5 = puVar5 + sVar1;
    }
  }
  return;
}

Assistant:

inline void nextRound(uint32_t rounds, uint32_t roundSize)
    {
        m_rounds[index()]++;

        if ((m_rounds[index()] % rounds) == 0) {
            for (size_t i = 0; i < N; ++i) {
                *nonce(i) = Nonce::next(index(), *nonce(i), rounds * roundSize);
            }
        }
        else {
            for (size_t i = 0; i < N; ++i) {
                *nonce(i) += roundSize;
            }
        }
    }